

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_statemach_act(connectdata *conn)

{
  ulong uVar1;
  anon_union_264_9_0449b319_for_proto *pp;
  uint *puVar2;
  curl_usessl cVar3;
  void *pvVar4;
  uint uVar5;
  _Bool _Var6;
  CURLcode CVar7;
  imapstate iVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  curl_socket_t sockfd;
  uint uVar13;
  long lVar14;
  char *pcVar15;
  SessionHandle *pSVar16;
  smtp_conn *smtpc;
  char *initresp;
  size_t len;
  size_t len_3;
  smtpstate state1;
  int smtpcode;
  size_t nread;
  char *local_78;
  char *local_70;
  char *local_68;
  curl_socket_t local_60;
  smtpstate local_5c;
  size_t local_58;
  uint local_4c;
  void *local_48;
  SessionHandle *local_40;
  size_t local_38;
  
  sockfd = conn->sock[0];
  local_40 = conn->data;
  local_38 = 0;
  if ((conn->proto).imapc.state == IMAP_AUTHENTICATE_PLAIN) {
    return CURLE_NOT_BUILT_IN;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar7 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar7;
  }
LAB_0048a31e:
  CVar7 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,(int *)&local_4c,&local_38);
  uVar5 = local_4c;
  if (CVar7 != CURLE_OK) {
    return CVar7;
  }
  iVar8 = (conn->proto).imapc.state;
  if (local_4c != 1 && iVar8 != IMAP_APPEND_FINAL) {
    (local_40->info).httpcode = local_4c;
  }
  if (local_4c == 0) {
    return CURLE_OK;
  }
  switch(iVar8) {
  case IMAP_SERVERGREET:
    if (local_4c - 200 < 100) {
      (conn->proto).ftpc.dirdepth = 0;
      (conn->proto).imapc.cmdid = 0;
      (conn->proto).imapc.resptag[0] = '\0';
      (conn->proto).imapc.resptag[2] = '\0';
      CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"EHLO %s",(conn->proto).ftpc.dirs);
      if (CVar7 == CURLE_OK) {
        (conn->proto).imapc.state = IMAP_CAPABILITY;
      }
    }
    else {
      Curl_failf(conn->data,"Got unexpected smtp-server response: %d",(ulong)local_4c);
      CVar7 = CURLE_FTP_WEIRD_SERVER_REPLY;
    }
    break;
  case IMAP_CAPABILITY:
    pSVar16 = conn->data;
    if (local_4c - 300 < 0xffffff9c && local_4c != 1) {
      if ((CURLUSESSL_TRY < (pSVar16->set).use_ssl) && (conn->ssl[0].use != true))
      goto LAB_0048a071;
      (conn->proto).imapc.cmdid = 0;
      CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"HELO %s",(conn->proto).ftpc.dirs);
      if (CVar7 == CURLE_OK) {
        (conn->proto).imapc.state = IMAP_STARTTLS;
      }
    }
    else {
      sVar9 = strlen((pSVar16->state).buffer);
      uVar1 = sVar9 - 4;
      if ((uVar1 < 8) || (*(long *)((pSVar16->state).buffer + 4) != 0x534c545452415453)) {
        if ((uVar1 < 4) || (*(int *)((pSVar16->state).buffer + 4) != 0x455a4953)) {
          if ((4 < uVar1) &&
             ((pSVar16->state).buffer[8] == ' ' &&
              *(int *)((pSVar16->state).buffer + 4) == 0x48545541)) {
            (conn->proto).imapc.resptag[2] = '\x01';
            lVar10 = sVar9 - 9;
            if (lVar10 != 0) {
              pcVar15 = (pSVar16->state).buffer + 9;
              do {
                while ((0x20 < (ulong)(byte)*pcVar15 ||
                       ((0x100002600U >> ((ulong)(byte)*pcVar15 & 0x3f) & 1) == 0))) {
                  lVar14 = lVar10 + (ulong)(lVar10 == 0);
                  lVar11 = 0;
                  do {
                    if (((ulong)(byte)pcVar15[lVar11] < 0x21) &&
                       (lVar12 = lVar11,
                       (0x100002600U >> ((ulong)(byte)pcVar15[lVar11] & 0x3f) & 1) != 0)) break;
                    lVar11 = lVar11 + 1;
                    lVar12 = lVar14;
                  } while (lVar14 != lVar11);
                  if (lVar12 == 5) {
                    if (pcVar15[4] == 0x4e && *(int *)pcVar15 == 0x49474f4c) {
                      uVar13 = 1;
                    }
                    else {
                      if (pcVar15[4] != 0x4e || *(int *)pcVar15 != 0x49414c50) goto LAB_00489f54;
                      uVar13 = 2;
                    }
LAB_0048a038:
                    puVar2 = &(conn->proto).imapc.prefmech;
                    *puVar2 = *puVar2 | uVar13;
                  }
                  else {
LAB_00489f54:
                    if ((lVar12 == 8) && (*(long *)pcVar15 == 0x35444d2d4d415243)) {
                      uVar13 = 4;
                      goto LAB_0048a038;
                    }
                    if (lVar12 == 6) {
                      if (*(short *)(pcVar15 + 4) != 0x4950 || *(int *)pcVar15 != 0x41535347)
                      goto LAB_00489fba;
                      uVar13 = 0x10;
                      goto LAB_0048a038;
                    }
                    if ((lVar12 == 10) &&
                       (*(short *)(pcVar15 + 8) == 0x3544 && *(long *)pcVar15 == 0x4d2d545345474944)
                       ) {
                      uVar13 = 8;
                      goto LAB_0048a038;
                    }
LAB_00489fba:
                    if ((lVar12 == 8) && (*(long *)pcVar15 == 0x4c414e5245545845)) {
                      uVar13 = 0x20;
                      goto LAB_0048a038;
                    }
                    if (lVar12 == 7) {
                      if (*(int *)(pcVar15 + 3) == 0x32485455 && *(int *)pcVar15 == 0x55414f58) {
                        uVar13 = 0x80;
                        goto LAB_0048a038;
                      }
                    }
                    else if ((lVar12 == 4) && (*(int *)pcVar15 == 0x4d4c544e)) {
                      uVar13 = 0x40;
                      goto LAB_0048a038;
                    }
                  }
                  pcVar15 = pcVar15 + lVar12;
                  lVar10 = lVar10 - lVar12;
                  if (lVar10 == 0) goto LAB_0048a226;
                }
                pcVar15 = pcVar15 + 1;
                lVar10 = lVar10 + -1;
              } while (lVar10 != 0);
            }
          }
        }
        else {
          (conn->proto).imapc.resptag[1] = '\x01';
        }
      }
      else {
        (conn->proto).imapc.resptag[0] = '\x01';
      }
LAB_0048a226:
      CVar7 = CURLE_OK;
      if (uVar5 != 1) {
        cVar3 = (pSVar16->set).use_ssl;
        if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
          if ((conn->proto).imapc.resptag[0] == '\x01') {
            CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","STARTTLS");
            if (CVar7 == CURLE_OK) {
              (conn->proto).imapc.state = IMAP_UPGRADETLS;
            }
            break;
          }
          if (cVar3 != CURLUSESSL_TRY) {
            Curl_failf(pSVar16,"STARTTLS not supported.");
            goto LAB_00489b24;
          }
        }
LAB_0048a244:
        CVar7 = smtp_perform_authentication(conn);
      }
    }
    break;
  case IMAP_STARTTLS:
    if (local_4c - 200 < 100) goto switchD_00489815_caseD_5;
    pSVar16 = conn->data;
LAB_0048a071:
    Curl_failf(pSVar16,"Remote access denied: %d",(ulong)local_4c);
    CVar7 = CURLE_REMOTE_ACCESS_DENIED;
    break;
  case IMAP_UPGRADETLS:
    CVar7 = CURLE_NOT_BUILT_IN;
    if (local_4c != 0xdc) {
      if ((conn->data->set).use_ssl == CURLUSESSL_TRY) goto LAB_0048a244;
      Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)local_4c);
LAB_00489b24:
      CVar7 = CURLE_USE_SSL_FAILED;
    }
    break;
  default:
    goto switchD_00489815_caseD_5;
  case IMAP_AUTHENTICATE_LOGIN:
    pSVar16 = conn->data;
    local_70 = (char *)0x0;
    local_78 = (char *)0x0;
    if (local_4c == 0x14e) {
      CVar7 = Curl_sasl_create_plain_message
                        (pSVar16,conn->user,conn->passwd,&local_78,(size_t *)&local_70);
      goto LAB_00489b80;
    }
LAB_00489bb8:
    local_70 = (char *)0x0;
    local_78 = (char *)0x0;
    Curl_failf(pSVar16,"Access denied: %d",(ulong)local_4c);
    CVar7 = CURLE_LOGIN_DENIED;
    goto LAB_00489bcf;
  case IMAP_AUTHENTICATE_LOGIN_PASSWD:
    pSVar16 = conn->data;
    local_70 = (char *)0x0;
    local_78 = (char *)0x0;
    if (local_4c != 0x14e) goto LAB_00489bb8;
    CVar7 = Curl_sasl_create_login_message(pSVar16,conn->user,&local_78,(size_t *)&local_70);
    if ((local_78 == (char *)0x0 || CVar7 != CURLE_OK) ||
       (CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar7 != CURLE_OK)) goto LAB_00489bcf;
    (conn->proto).imapc.state = IMAP_AUTHENTICATE_CRAMMD5;
    goto LAB_0048a1f0;
  case IMAP_AUTHENTICATE_CRAMMD5:
    pSVar16 = conn->data;
    local_70 = (char *)0x0;
    local_78 = (char *)0x0;
    if (local_4c != 0x14e) goto LAB_00489bb8;
    CVar7 = Curl_sasl_create_login_message(pSVar16,conn->passwd,&local_78,(size_t *)&local_70);
    goto LAB_00489b80;
  case IMAP_AUTHENTICATE_DIGESTMD5:
    pSVar16 = conn->data;
    local_70 = (char *)0x0;
    local_78 = (char *)0x0;
    local_68 = (char *)0x0;
    local_58 = 0;
    if (local_4c == 0x14e) {
      smtp_get_message((pSVar16->state).buffer,&local_78);
      CVar7 = Curl_sasl_decode_cram_md5_message(local_78,&local_70,&local_58);
      if (CVar7 == CURLE_OK) {
        CVar7 = Curl_sasl_create_cram_md5_message
                          (pSVar16,local_70,conn->user,conn->passwd,&local_68,&local_58);
        if ((local_68 != (char *)0x0 && CVar7 == CURLE_OK) &&
           (CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar7 == CURLE_OK)) {
          iVar8 = IMAP_LOGIN;
          goto LAB_0048a2d4;
        }
      }
      else {
        CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","*");
        if (CVar7 == CURLE_OK) {
          iVar8 = IMAP_AUTHENTICATE_FINAL;
LAB_0048a2d4:
          (conn->proto).imapc.state = iVar8;
          CVar7 = CURLE_OK;
        }
      }
      if (local_70 != (char *)0x0) {
        (*Curl_cfree)(local_70);
        local_70 = (char *)0x0;
      }
      if (local_68 != (char *)0x0) {
        (*Curl_cfree)(local_68);
        local_68 = (char *)0x0;
      }
    }
    else {
LAB_00489db0:
      local_68 = (char *)0x0;
      local_70 = (char *)0x0;
      local_78 = (char *)0x0;
      pcVar15 = "Access denied: %d";
LAB_00489dba:
      Curl_failf(pSVar16,pcVar15,(ulong)local_4c);
LAB_00489dc4:
      CVar7 = CURLE_LOGIN_DENIED;
    }
    break;
  case IMAP_AUTHENTICATE_DIGESTMD5_RESP:
    pSVar16 = conn->data;
    local_70 = (char *)0x0;
    local_78 = (char *)0x0;
    local_68 = (char *)0x0;
    if (local_4c != 0x14e) goto LAB_00489db0;
    smtp_get_message((pSVar16->state).buffer,&local_70);
    CVar7 = Curl_sasl_create_digest_md5_message
                      (pSVar16,local_70,conn->user,conn->passwd,"smtp",&local_78,(size_t *)&local_68
                      );
    if (CVar7 == CURLE_OK) {
      CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s",local_78);
      if (CVar7 == CURLE_OK) {
        iVar8 = IMAP_AUTHENTICATE_NTLM;
        goto LAB_0048a1ea;
      }
    }
    else if ((CVar7 == CURLE_BAD_CONTENT_ENCODING) &&
            (CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","*"), CVar7 == CURLE_OK)) {
      iVar8 = IMAP_AUTHENTICATE_FINAL;
LAB_0048a1ea:
      (conn->proto).imapc.state = iVar8;
      goto LAB_0048a1f0;
    }
    goto LAB_00489bcf;
  case IMAP_AUTHENTICATE_NTLM:
    if (local_4c != 0x14e) {
LAB_00489d05:
      pSVar16 = conn->data;
      pcVar15 = "Authentication failed: %d";
      goto LAB_00489dba;
    }
    CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","");
    if (CVar7 != CURLE_OK) break;
    (conn->proto).imapc.state = IMAP_LOGIN;
    goto LAB_00489b4a;
  case IMAP_AUTHENTICATE_CANCEL:
    pSVar16 = conn->data;
    local_70 = (char *)0x0;
    local_78 = (char *)0x0;
    if (local_4c != 0x14e) goto LAB_00489bb8;
    CVar7 = Curl_sasl_create_xoauth2_message
                      (pSVar16,conn->user,conn->xoauth2_bearer,&local_78,(size_t *)&local_70);
LAB_00489b80:
    if ((local_78 != (char *)0x0 && CVar7 == CURLE_OK) &&
       (CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar7 == CURLE_OK)) {
      (conn->proto).imapc.state = IMAP_LOGIN;
LAB_0048a1f0:
      CVar7 = CURLE_OK;
    }
LAB_00489bcf:
    if (local_78 != (char *)0x0) {
      (*Curl_cfree)(local_78);
      local_78 = (char *)0x0;
    }
    break;
  case IMAP_AUTHENTICATE_FINAL:
    pSVar16 = conn->data;
    local_70 = (char *)0x0;
    local_78 = (char *)0x0;
    local_68 = (char *)0x0;
    local_58 = local_58 & 0xffffffff00000000;
    local_5c = SMTP_STOP;
    puVar2 = &(conn->proto).imapc.prefmech;
    *puVar2 = *puVar2 ^ (conn->proto).pop3c.authtypes;
    CVar7 = smtp_calc_sasl_details
                      (conn,&local_70,&local_78,(size_t *)&local_68,(smtpstate *)&local_58,&local_5c
                      );
    if (CVar7 == CURLE_OK) {
      if (local_70 != (char *)0x0) {
        CVar7 = smtp_perform_auth(conn,local_70,local_78,(size_t)local_68,(smtpstate)local_58,
                                  local_5c);
        goto LAB_00489bcf;
      }
      Curl_failf(pSVar16,"Authentication cancelled");
      goto LAB_00489dc4;
    }
    break;
  case IMAP_LOGIN:
    if (local_4c != 0xeb) goto LAB_00489d05;
    goto switchD_00489815_caseD_5;
  case IMAP_LIST:
    pSVar16 = conn->data;
    pvVar4 = (pSVar16->req).protop;
    pcVar15 = (pSVar16->state).buffer;
    local_60 = sockfd;
    sVar9 = strlen(pcVar15);
    if (((((uVar5 - 300 < 0xffffff9c) && (*(long *)((long)pvVar4 + 0x10) != 0)) && (uVar5 != 0x229))
        && (uVar5 != 1)) ||
       (((uVar5 - 300 < 0xffffff9c && (uVar5 != 1)) && (*(long *)((long)pvVar4 + 0x10) == 0)))) {
      Curl_failf(pSVar16,"Command failed: %d",(ulong)uVar5);
      CVar7 = CURLE_RECV_ERROR;
      sockfd = local_60;
    }
    else {
      CVar7 = CURLE_OK;
      local_48 = pvVar4;
      if ((pSVar16->set).opt_no_body == false) {
        pcVar15[sVar9] = '\n';
        CVar7 = Curl_client_write(conn,1,pcVar15,sVar9 + 1);
        pcVar15[sVar9] = '\0';
      }
      sockfd = local_60;
      if (uVar5 != 1) {
        if ((*(long *)((long)local_48 + 0x10) == 0) ||
           (lVar10 = *(long *)(*(long *)((long)local_48 + 0x10) + 8),
           *(long *)((long)local_48 + 0x10) = lVar10, lVar10 == 0)) goto LAB_00489e2a;
        CVar7 = smtp_perform_command(conn);
      }
    }
    break;
  case IMAP_SELECT:
    if (local_4c - 200 < 100) {
LAB_00489cc0:
      CVar7 = smtp_perform_rcpt_to(conn);
    }
    else {
      pSVar16 = conn->data;
      pcVar15 = "MAIL failed: %d";
LAB_0048a09d:
      Curl_failf(pSVar16,pcVar15,(ulong)local_4c);
      CVar7 = CURLE_SEND_ERROR;
    }
    break;
  case IMAP_FETCH:
    pSVar16 = conn->data;
    if (99 < local_4c - 200) {
      pcVar15 = "RCPT failed: %d";
      goto LAB_0048a09d;
    }
    pvVar4 = (pSVar16->req).protop;
    lVar10 = *(long *)(*(long *)((long)pvVar4 + 0x10) + 8);
    *(long *)((long)pvVar4 + 0x10) = lVar10;
    if (lVar10 != 0) goto LAB_00489cc0;
    CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","DATA");
    if (CVar7 == CURLE_OK) {
      (conn->proto).imapc.state = IMAP_FETCH_FINAL;
      goto LAB_00489b4a;
    }
    break;
  case IMAP_FETCH_FINAL:
    pSVar16 = conn->data;
    if (local_4c != 0x162) {
      pcVar15 = "DATA failed: %d";
      goto LAB_0048a09d;
    }
    Curl_pgrsSetUploadSize(pSVar16,(pSVar16->state).infilesize);
    CVar7 = CURLE_OK;
    Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
    goto LAB_00489e2a;
  case IMAP_APPEND:
    CVar7 = CURLE_RECV_ERROR;
    if (local_4c == 0xfa) {
      CVar7 = CURLE_OK;
    }
LAB_00489e2a:
    (conn->proto).imapc.state = IMAP_STOP;
  }
LAB_0048a24f:
  if (CVar7 != CURLE_OK) {
    return CVar7;
  }
  if ((conn->proto).imapc.state == IMAP_STOP) {
    return CURLE_OK;
  }
  _Var6 = Curl_pp_moredata(&(pp->ftpc).pp);
  if (!_Var6) {
    return CURLE_OK;
  }
  goto LAB_0048a31e;
switchD_00489815_caseD_5:
  (conn->proto).imapc.state = IMAP_STOP;
LAB_00489b4a:
  CVar7 = CURLE_OK;
  goto LAB_0048a24f;
}

Assistant:

static CURLcode smtp_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct SessionHandle *data = conn->data;
  int smtpcode;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not SMTP */
  if(smtpc->state == SMTP_UPGRADETLS)
    return smtp_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &smtpcode, &nread);
    if(result)
      return result;

    /* Store the latest response for later retrieval if necessary */
    if(smtpc->state != SMTP_QUIT && smtpcode != 1)
      data->info.httpcode = smtpcode;

    if(!smtpcode)
      break;

    /* We have now received a full SMTP server response */
    switch(smtpc->state) {
    case SMTP_SERVERGREET:
      result = smtp_state_servergreet_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_EHLO:
      result = smtp_state_ehlo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_HELO:
      result = smtp_state_helo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_STARTTLS:
      result = smtp_state_starttls_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_PLAIN:
      result = smtp_state_auth_plain_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_LOGIN:
      result = smtp_state_auth_login_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_LOGIN_PASSWD:
      result = smtp_state_auth_login_password_resp(conn, smtpcode,
                                                   smtpc->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case SMTP_AUTH_CRAMMD5:
      result = smtp_state_auth_cram_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_DIGESTMD5:
      result = smtp_state_auth_digest_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_DIGESTMD5_RESP:
      result = smtp_state_auth_digest_resp_resp(conn, smtpcode, smtpc->state);
      break;
#endif

#ifdef USE_NTLM
    case SMTP_AUTH_NTLM:
      result = smtp_state_auth_ntlm_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_NTLM_TYPE2MSG:
      result = smtp_state_auth_ntlm_type2msg_resp(conn, smtpcode,
                                                  smtpc->state);
      break;
#endif

#if defined(USE_WINDOWS_SSPI)
    case SMTP_AUTH_GSSAPI:
      result = smtp_state_auth_gssapi_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_GSSAPI_TOKEN:
      result = smtp_state_auth_gssapi_token_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_GSSAPI_NO_DATA:
      result = smtp_state_auth_gssapi_no_data_resp(conn, smtpcode,
                                                   smtpc->state);
      break;
#endif

    case SMTP_AUTH_XOAUTH2:
      result = smtp_state_auth_xoauth2_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_CANCEL:
      result = smtp_state_auth_cancel_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_FINAL:
      result = smtp_state_auth_final_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_COMMAND:
      result = smtp_state_command_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_MAIL:
      result = smtp_state_mail_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_RCPT:
      result = smtp_state_rcpt_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_DATA:
      result = smtp_state_data_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_POSTDATA:
      result = smtp_state_postdata_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, SMTP_STOP);
      break;
    }
  } while(!result && smtpc->state != SMTP_STOP && Curl_pp_moredata(pp));

  return result;
}